

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool testing::internal::
     TypeParameterizedTest<ParticleArrayTest,_testing::internal::TemplateSel<ParticleArrayTest_Back_Test>,_testing::internal::Types5<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>,_pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>,_pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>,_pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>,_pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>_>
     ::Register(char *prefix,char *case_name,char *test_names,int index)

{
  bool bVar1;
  char *value_param;
  SetUpTestCaseFunc set_up_tc;
  String *this;
  uint in_ECX;
  char *pcVar2;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  TestFactoryImpl<ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>_>
  *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  String *this_00;
  char *in_stack_ffffffffffffffa0;
  TearDownTestCaseFunc in_stack_ffffffffffffffb0;
  TestFactoryBase *in_stack_ffffffffffffffb8;
  String local_40;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  pcVar2 = "/";
  if (*in_RDI == '\0') {
    pcVar2 = "";
  }
  this_00 = (String *)&stack0xffffffffffffffd0;
  String::Format((char *)this_00,"%s%s%s/%d",in_RDI,pcVar2,in_RSI,(ulong)in_ECX);
  pcVar2 = String::c_str(this_00);
  GetPrefixUntilComma(in_stack_ffffffffffffff68);
  value_param = String::c_str(&local_40);
  GetTypeName<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>>>();
  String::c_str((String *)&stack0xffffffffffffffa0);
  set_up_tc = (SetUpTestCaseFunc)
              GetTypeId<ParticleArrayTest<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>>>>
                        ();
  this = (String *)operator_new(8);
  TestFactoryImpl<ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>_>
  ::TestFactoryImpl(in_stack_ffffffffffffff60);
  MakeAndRegisterTestInfo
            (in_stack_ffffffffffffffa0,pcVar2,(char *)this_00,value_param,this,set_up_tc,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  String::~String(this);
  String::~String(this);
  String::~String(this);
  bVar1 = TypeParameterizedTest<ParticleArrayTest,_testing::internal::TemplateSel<ParticleArrayTest_Back_Test>,_testing::internal::Types4<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>,_pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>,_pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>,_pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>_>
          ::Register(in_RSI,in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, const char* case_name,
                       const char* test_names, int index) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        String::Format("%s%s%s/%d", prefix, prefix[0] == '\0' ? "" : "/",
                       case_name, index).c_str(),
        GetPrefixUntilComma(test_names).c_str(),
        GetTypeName<Type>().c_str(),
        NULL,  // No value parameter.
        GetTypeId<FixtureClass>(),
        TestClass::SetUpTestCase,
        TestClass::TearDownTestCase,
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>
        ::Register(prefix, case_name, test_names, index + 1);
  }